

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall Memory::Recycler::ShouldIdleCollectOnExit(Recycler *this)

{
  uint uVar1;
  ulong uVar2;
  undefined4 *puVar3;
  code *pcVar4;
  bool bVar5;
  DWORD DVar6;
  DWORD DVar7;
  ulong uVar8;
  undefined8 *in_FS_OFFSET;
  
  (this->autoHeap).uncollectedNewPageCount = 0;
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    bVar5 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Force,IdleCollectPhase);
    if (bVar5) {
      return true;
    }
    if (((this->autoHeap).uncollectedAllocBytes <
         (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit) ||
       (uVar1 = this->tickCountNextCollection, DVar6 = GetTickCount(), DVar6 <= uVar1 - 300)) {
      if ((this->collectionState).value != CollectionStateNotCollecting) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)*in_FS_OFFSET;
        *puVar3 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x1aa4,"(!this->CollectionInProgress())","!this->CollectionInProgress()"
                          );
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar3 = 0;
      }
      return 0xfffff < (this->autoHeap).uncollectedAllocBytes;
    }
    bVar5 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,IdleCollectPhase);
    if (bVar5) {
      uVar2 = (this->autoHeap).uncollectedAllocBytes;
      uVar8 = (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit;
      DVar6 = GetCurrentThreadId();
      if (uVar2 < uVar8) {
        uVar1 = this->tickCountNextCollection;
        DVar7 = GetTickCount();
        Output::Print(L"%04X> Idle collect on exit: time %d\n",(ulong)DVar6,(ulong)(uVar1 - DVar7));
      }
      else {
        Output::Print(L"%04X> Idle collect on exit: alloc %d\n",(ulong)DVar6,
                      (this->autoHeap).uncollectedAllocBytes);
      }
      Output::Flush();
    }
    CollectNow<(Memory::CollectionFlags)268439552>(this);
  }
  else {
    bVar5 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,IdleCollectPhase);
    if ((bVar5) && (this->recyclerFlagsTable->Verbose == true)) {
      DVar6 = GetCurrentThreadId();
      Output::Print(L"%04X> Skipping scheduling Idle Collect. Reason: Collection in progress\n",
                    (ulong)DVar6);
      Output::Flush();
      return false;
    }
  }
  return false;
}

Assistant:

bool
Recycler::ShouldIdleCollectOnExit()
{
    // Always reset partial heuristics even if we are not doing idle collecting
    // So we don't carry the heuristics to the next script activation
    this->ResetPartialHeuristicCounters();

    if (this->CollectionInProgress())
    {
#ifdef RECYCLER_TRACE
        CUSTOM_PHASE_PRINT_VERBOSE_TRACE1(GetRecyclerFlagsTable(), Js::IdleCollectPhase, _u("%04X> Skipping scheduling Idle Collect. Reason: Collection in progress\n"), ::GetCurrentThreadId());
#endif

        // Don't schedule an idle collect if there is a collection going on already
        // IDLE-GC-TODO: Fix ResetHeuristics in the GC so we can detect memory allocation during
        // the concurrent collect and still schedule an idle collect
        return false;
    }

    if (CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::IdleCollectPhase))
    {
        return true;
    }

    uint32 nextTime = tickCountNextCollection - tickDiffToNextCollect;
    // We will try to start a concurrent collect if we are within .9 ms to next scheduled collection, AND,
    // the size of allocation is larger than 32M. This is similar to CollectionAllocation logic, just
    // earlier in both time heuristic and size heuristic, so we can do some concurrent GC while we are
    // not in script.
    if (autoHeap.uncollectedAllocBytes >= RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit
        && GetTickCount() > nextTime)
    {
#ifdef RECYCLER_TRACE
        if (CUSTOM_PHASE_TRACE1(GetRecyclerFlagsTable(), Js::IdleCollectPhase))
        {
            if (autoHeap.uncollectedAllocBytes >= RecyclerHeuristic::Instance.MaxUncollectedAllocBytesOnExit)
            {
                Output::Print(_u("%04X> Idle collect on exit: alloc %d\n"), ::GetCurrentThreadId(), autoHeap.uncollectedAllocBytes);
            }
            else
            {
                Output::Print(_u("%04X> Idle collect on exit: time %d\n"), ::GetCurrentThreadId(), tickCountNextCollection - GetTickCount());
            }
            Output::Flush();
        }
#endif

        this->CollectNow<CollectNowConcurrent>();
        return false;
    }

    Assert(!this->CollectionInProgress());
    // Idle GC use the size heuristic. Only need to schedule on if we passed it.
    return (autoHeap.uncollectedAllocBytes >= RecyclerHeuristic::IdleUncollectedAllocBytesCollection);
}